

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateState.cpp
# Opt level: O1

void __thiscall helics::FederateState::addFederateToDelay(FederateState *this,GlobalFederateId gid)

{
  const_iterator cVar1;
  iterator __position;
  const_iterator __position_00;
  ulong uVar2;
  ulong uVar3;
  value_type local_4;
  
  cVar1._M_current =
       (this->delayedFederates).
       super__Vector_base<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>.
       _M_impl.super__Vector_impl_data._M_start;
  __position._M_current =
       (this->delayedFederates).
       super__Vector_base<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if ((cVar1._M_current != __position._M_current) && (gid.gid <= __position._M_current[-1].gid)) {
    uVar3 = (long)__position._M_current - (long)cVar1._M_current >> 2;
    while (__position_00._M_current = cVar1._M_current, 0 < (long)uVar3) {
      uVar2 = uVar3 >> 1;
      uVar3 = ~uVar2 + uVar3;
      cVar1._M_current = __position_00._M_current + uVar2 + 1;
      if (gid.gid <= __position_00._M_current[uVar2].gid) {
        cVar1._M_current = __position_00._M_current;
        uVar3 = uVar2;
      }
    }
    if (__position_00._M_current != __position._M_current) {
      if ((__position_00._M_current)->gid == gid.gid) {
        return;
      }
      std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>::insert
                (&this->delayedFederates,__position_00,&local_4);
      return;
    }
  }
  if (__position._M_current ==
      (this->delayedFederates).
      super__Vector_base<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<helics::GlobalFederateId,std::allocator<helics::GlobalFederateId>>::
    _M_realloc_insert<helics::GlobalFederateId_const&>
              ((vector<helics::GlobalFederateId,std::allocator<helics::GlobalFederateId>> *)
               &this->delayedFederates,__position,&local_4);
  }
  else {
    (__position._M_current)->gid = gid.gid;
    (this->delayedFederates).
    super__Vector_base<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>._M_impl.
    super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  return;
}

Assistant:

void FederateState::addFederateToDelay(GlobalFederateId gid)
{
    if ((delayedFederates.empty()) || (gid > delayedFederates.back())) {
        delayedFederates.push_back(gid);
        return;
    }
    auto res = std::lower_bound(delayedFederates.begin(), delayedFederates.end(), gid);
    if (res == delayedFederates.end()) {
        delayedFederates.push_back(gid);
        return;
    }
    if (*res != gid) {
        delayedFederates.insert(res, gid);
    }
}